

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxy.cpp
# Opt level: O0

uint __thiscall Shell::EqualityProxy::getProxyPredicate(EqualityProxy *this)

{
  initializer_list<Kernel::TermList> sorts;
  TermList sort_00;
  int iVar1;
  InferenceStore *this_00;
  void *pvVar2;
  Inference *this_01;
  NonspecificInference0 *gi;
  size_type in_RDI;
  char *unaff_retaddr;
  uint in_stack_0000000c;
  Signature *in_stack_00000010;
  Formula *quantDefForm;
  Formula *defForm;
  Literal *eqLit;
  Literal *proxyLit;
  OperatorType *predType;
  Symbol *predSym;
  TermList var2;
  TermList var1;
  TermList sort;
  uint newPred;
  Formula *in_stack_fffffffffffffec8;
  TermList in_stack_fffffffffffffed0;
  size_t in_stack_fffffffffffffed8;
  Stack<Kernel::TermList> *in_stack_fffffffffffffee0;
  TermStack *this_02;
  uint uVar3;
  undefined4 uVar4;
  undefined8 in_stack_fffffffffffffef0;
  iterator in_stack_fffffffffffffef8;
  NonspecificInference0 local_f2;
  Inference *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  uint in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff24;
  TermList in_stack_ffffffffffffff28;
  TermList in_stack_ffffffffffffff30;
  Formula *in_stack_ffffffffffffff90;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 *local_50;
  undefined8 local_48;
  OperatorType *local_40;
  Symbol *local_38;
  undefined8 local_20;
  uint local_14;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  Connective con;
  
  uVar3 = (uint)((ulong)in_stack_fffffffffffffef0 >> 0x20);
  if ((*(byte *)(in_RDI + 4) & 1) == 0) {
    local_14 = Kernel::Signature::addFreshPredicate
                         (in_stack_00000010,in_stack_0000000c,unaff_retaddr,
                          (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    Kernel::TermList::TermList
              ((TermList *)in_stack_fffffffffffffed0._content,
               (uint)((ulong)in_stack_fffffffffffffec8 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffec8 >> 0x18,0));
    Kernel::TermList::TermList
              ((TermList *)in_stack_fffffffffffffed0._content,
               (uint)((ulong)in_stack_fffffffffffffec8 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffec8 >> 0x18,0));
    Kernel::TermList::TermList
              ((TermList *)in_stack_fffffffffffffed0._content,
               (uint)((ulong)in_stack_fffffffffffffec8 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffec8 >> 0x18,0));
    local_38 = Kernel::Signature::getPredicate
                         ((Signature *)in_stack_fffffffffffffed0._content,
                          (uint)((ulong)in_stack_fffffffffffffec8 >> 0x20));
    local_60 = local_20;
    local_58 = local_20;
    local_50 = &local_60;
    local_48 = 2;
    sorts._M_len = in_RDI;
    sorts._M_array = in_stack_fffffffffffffef8;
    local_40 = Kernel::OperatorType::getPredicateType(sorts,uVar3);
    Kernel::Signature::Symbol::setType
              ((Symbol *)in_stack_fffffffffffffed0._content,
               (OperatorType *)in_stack_fffffffffffffec8);
    Kernel::Signature::Symbol::markEqualityProxy(local_38);
    Kernel::Signature::Symbol::markSkipCongruence(local_38);
    if (getProxyPredicate()::args == '\0') {
      iVar1 = __cxa_guard_acquire(&getProxyPredicate()::args);
      if (iVar1 != 0) {
        Lib::Stack<Kernel::TermList>::Stack(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        __cxa_atexit(Lib::Stack<Kernel::TermList>::~Stack,&getProxyPredicate::args,&__dso_handle);
        __cxa_guard_release(&getProxyPredicate()::args);
      }
    }
    this_02 = &getProxyPredicate::args;
    Lib::Stack<Kernel::TermList>::reset(&getProxyPredicate::args);
    Lib::Stack<Kernel::TermList>::push
              ((Stack<Kernel::TermList> *)in_stack_fffffffffffffec8,in_stack_fffffffffffffed0);
    Lib::Stack<Kernel::TermList>::push
              ((Stack<Kernel::TermList> *)in_stack_fffffffffffffec8,in_stack_fffffffffffffed0);
    Lib::Stack<Kernel::TermList>::push
              ((Stack<Kernel::TermList> *)in_stack_fffffffffffffec8,in_stack_fffffffffffffed0);
    uVar3 = local_14;
    Lib::Stack<Kernel::TermList>::begin(this_02);
    uVar4 = 1;
    Kernel::Literal::create
              (in_stack_ffffffffffffff24,in_stack_ffffffffffffff20,(bool)in_stack_ffffffffffffff1f,
               (TermList *)in_stack_ffffffffffffff10);
    sort_00._content._4_4_ = in_stack_ffffffffffffff24;
    sort_00._content._0_4_ = in_stack_ffffffffffffff20;
    Kernel::Literal::createEquality
              ((bool)in_stack_ffffffffffffff1f,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               sort_00);
    this_00 = (InferenceStore *)Kernel::BinaryFormula::operator_new(0xb8fdd8);
    Kernel::AtomicFormula::operator_new(0xb8fde7);
    Kernel::AtomicFormula::AtomicFormula
              ((AtomicFormula *)in_stack_fffffffffffffed0._content,
               (Literal *)in_stack_fffffffffffffec8);
    pvVar2 = Kernel::AtomicFormula::operator_new(0xb8fe0c);
    con = (Connective)((ulong)pvVar2 >> 0x20);
    Kernel::AtomicFormula::AtomicFormula
              ((AtomicFormula *)in_stack_fffffffffffffed0._content,
               (Literal *)in_stack_fffffffffffffec8);
    Kernel::BinaryFormula::BinaryFormula
              ((BinaryFormula *)this_02,con,(Formula *)in_stack_fffffffffffffed0._content,
               in_stack_fffffffffffffec8);
    this_01 = (Inference *)Kernel::Formula::quantify(in_stack_ffffffffffffff90);
    gi = (NonspecificInference0 *)Kernel::FormulaUnit::operator_new(0xb8fe6b);
    Kernel::NonspecificInference0::NonspecificInference0(&local_f2,AXIOM,EQUALITY_PROXY_AXIOM1);
    Kernel::Inference::Inference(this_01,gi);
    Kernel::FormulaUnit::FormulaUnit
              ((FormulaUnit *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (Formula *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
               in_stack_ffffffffffffff10);
    *(NonspecificInference0 **)(in_RDI + 0x10) = gi;
    Kernel::Inference::~Inference((Inference *)&stack0xffffffffffffff10);
    Kernel::InferenceStore::instance();
    Kernel::InferenceStore::recordIntroducedSymbol
              (this_00,(Unit *)CONCAT44(uVar4,uVar3),(SymbolType)((ulong)this_02 >> 0x20),
               (uint)this_02);
    *(uint *)(in_RDI + 8) = local_14;
    *(undefined1 *)(in_RDI + 4) = 1;
  }
  else {
    local_14 = *(uint *)(in_RDI + 8);
  }
  return local_14;
}

Assistant:

unsigned EqualityProxy::getProxyPredicate()
{
  if(_addedPred){ return _proxyPredicate; }

  unsigned newPred = env.signature->addFreshPredicate(3,"sQ","eqProxy");

  TermList sort = TermList(0,false);
  TermList var1 = TermList(1,false);
  TermList var2 = TermList(2,false);

  Signature::Symbol* predSym = env.signature->getPredicate(newPred);
  OperatorType* predType = OperatorType::getPredicateType({sort, sort}, 1);
  predSym->setType(predType);
  predSym->markEqualityProxy();
  // don't need congruence axioms for the equality predicate itself
  predSym->markSkipCongruence();

  static TermStack args;
  args.reset();

  args.push(sort);
  args.push(var1);
  args.push(var2);

  Literal* proxyLit = Literal::create(newPred, 3, true, args.begin());
  Literal* eqLit = Literal::createEquality(true,var1,var2,sort);
  Formula* defForm = new BinaryFormula(IFF, new AtomicFormula(proxyLit), new AtomicFormula(eqLit));
  Formula* quantDefForm = Formula::quantify(defForm);

  _defUnit = new FormulaUnit(quantDefForm,NonspecificInference0(UnitInputType::AXIOM,InferenceRule::EQUALITY_PROXY_AXIOM1));

  InferenceStore::instance()->recordIntroducedSymbol(_defUnit, SymbolType::PRED, newPred);
  _proxyPredicate = newPred;
  _addedPred = true;
  return newPred;
}